

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_data_source_get_cursor_in_seconds(ma_data_source *pDataSource,float *pCursor)

{
  ma_result mVar1;
  ma_uint32 sampleRate;
  ma_uint64 cursorInPCMFrames;
  
  if (pCursor == (float *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0.0;
    mVar1 = ma_data_source_get_cursor_in_pcm_frames(pDataSource,&cursorInPCMFrames);
    if (mVar1 == MA_SUCCESS) {
      mVar1 = ma_data_source_get_data_format
                        (pDataSource,(ma_format *)0x0,(ma_uint32 *)0x0,&sampleRate,(ma_channel *)0x0
                         ,0);
      if (mVar1 == MA_SUCCESS) {
        *pCursor = (float)(long)cursorInPCMFrames / (float)sampleRate;
        mVar1 = MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_seconds(ma_data_source* pDataSource, float* pCursor)
{
    ma_result result;
    ma_uint64 cursorInPCMFrames;
    ma_uint32 sampleRate;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &cursorInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pCursor = (ma_int64)cursorInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}